

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluationFile.cxx
# Opt level: O3

void __thiscall
cmGeneratorExpressionEvaluationFile::Generate
          (cmGeneratorExpressionEvaluationFile *this,cmLocalGenerator *lg)

{
  pointer pcVar1;
  cmCompiledGeneratorExpression *pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  bool bVar4;
  ostream *poVar5;
  string *le;
  string *lang;
  string *li;
  undefined1 config [8];
  mode_t perm;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  enabledLanguages;
  cmGeneratorExpression contentGE;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  inputExpression;
  string inputContent;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allConfigs;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  outputFiles;
  mode_t local_47c;
  undefined1 local_478 [40];
  string local_450;
  cmListFileBacktrace local_430;
  string *local_420;
  undefined1 local_418 [32];
  pointer local_3f8;
  undefined8 local_3f0;
  undefined1 local_3e8;
  undefined7 uStack_3e7;
  string local_3d8;
  undefined1 local_3b8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_3b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8 [6];
  ios_base local_348 [272];
  undefined1 local_238 [32];
  _Base_ptr local_218;
  size_t local_210;
  
  local_47c = 0;
  local_3f8 = (pointer)&local_3e8;
  local_3f0 = 0;
  local_3e8 = 0;
  if (this->InputIsContent == true) {
    std::__cxx11::string::_M_assign((string *)&local_3f8);
  }
  else {
    local_478._0_8_ = local_478 + 0x10;
    pcVar1 = (this->Input)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_478,pcVar1,pcVar1 + (this->Input)._M_string_length);
    bVar4 = cmsys::SystemTools::FileIsFullPath((string *)local_478);
    if (bVar4) {
      cmsys::SystemTools::CollapseFullPath((string *)local_238,(string *)local_478);
    }
    else {
      FixRelativePath((string *)local_238,this,(string *)local_478,PathForInput,lg);
    }
    std::__cxx11::string::operator=((string *)local_478,(string *)local_238);
    if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
      operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&lg->Makefile->ListFiles,(value_type *)local_478);
    cmsys::SystemTools::GetPermissions((char *)local_478._0_8_,&local_47c);
    std::ifstream::ifstream(local_238,(char *)local_478._0_8_,_S_in);
    local_420 = (string *)
                CONCAT44(local_420._4_4_,
                         *(uint *)((long)&local_218 + *(long *)(local_238._0_8_ + -0x18)));
    if ((*(uint *)((long)&local_218 + *(long *)(local_238._0_8_ + -0x18)) & 5) == 0) {
      local_3b8 = (undefined1  [8])local_3a8;
      paStack_3b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
      local_3a8[0]._M_allocated_capacity = local_3a8[0]._M_allocated_capacity & 0xffffffffffffff00;
      local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
      local_450._M_string_length = 0;
      local_450.field_2._M_local_buf[0] = '\0';
      while (bVar4 = cmsys::SystemTools::GetLineFromStream
                               ((istream *)local_238,(string *)local_3b8,(bool *)0x0,-1), bVar4) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_418,&local_450,(string *)local_3b8);
        std::__cxx11::string::_M_append((char *)&local_3f8,local_418._0_8_);
        if ((cmCompiledGeneratorExpression *)local_418._0_8_ !=
            (cmCompiledGeneratorExpression *)(local_418 + 0x10)) {
          operator_delete((void *)local_418._0_8_,local_418._16_8_ + 1);
        }
        std::__cxx11::string::_M_replace
                  ((ulong)&local_450,0,(char *)local_450._M_string_length,0x4f52c9);
      }
      std::__cxx11::string::_M_append((char *)&local_3f8,(ulong)local_450._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p,
                        CONCAT71(local_450.field_2._M_allocated_capacity._1_7_,
                                 local_450.field_2._M_local_buf[0]) + 1);
      }
      if (local_3b8 != (undefined1  [8])local_3a8) {
        operator_delete((void *)local_3b8,local_3a8[0]._M_allocated_capacity + 1);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3b8,"Evaluation file \"",0x11);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_3b8,(char *)local_478._0_8_,local_478._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" cannot be read.",0x11);
      std::__cxx11::stringbuf::str();
      cmLocalGenerator::IssueMessage(lg,FATAL_ERROR,&local_450);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p,
                        CONCAT71(local_450.field_2._M_allocated_capacity._1_7_,
                                 local_450.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b8);
      std::ios_base::~ios_base(local_348);
    }
    std::ifstream::~ifstream(local_238);
    if ((string *)local_478._0_8_ != (string *)(local_478 + 0x10)) {
      operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
    }
    if (((ulong)local_420 & 5) != 0) goto LAB_002afa90;
  }
  pcVar2 = (this->OutputFileExpr)._M_t.
           super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
           .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl;
  local_430.TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)&(pcVar2->Backtrace).TopEntry;
  this_00 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(pcVar2->Backtrace).TopEntry + 8)
            )->_M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_430.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_430.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = this_00;
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
        goto LAB_002af8e3;
      }
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
LAB_002af8e3:
  cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)&local_450,&local_430);
  if (local_430.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_430.TopEntry.
               super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_418,&local_450);
  local_238._24_8_ = local_238 + 8;
  local_238._8_4_ = _S_red;
  local_238._16_8_ = 0;
  local_210 = 0;
  local_3a8[0]._M_allocated_capacity = 0;
  local_3b8 = (undefined1  [8])0x0;
  paStack_3b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
  local_218 = (_Base_ptr)local_238._24_8_;
  cmMakefile::GetConfigurations
            (&local_3d8,lg->Makefile,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_3b8,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._0_8_ + 1);
  }
  if (local_3b8 == (undefined1  [8])paStack_3b0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_3b8);
  }
  local_478._0_8_ = (string *)0x0;
  local_478._8_8_ = (string *)0x0;
  local_478._16_8_ = 0;
  cmGlobalGenerator::GetEnabledLanguages
            (lg->GlobalGenerator,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_478);
  local_420 = (string *)local_478._8_8_;
  if (local_478._0_8_ != local_478._8_8_) {
    config = local_3b8;
    paVar3 = paStack_3b0;
    lang = (string *)local_478._0_8_;
    do {
      for (; config != (undefined1  [8])paVar3; config = (undefined1  [8])((long)config + 0x20)) {
        Generate(this,lg,(string *)config,lang,(cmCompiledGeneratorExpression *)local_418._0_8_,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_238,local_47c);
        if ((cmSystemTools::s_FatalErrorOccured != false) ||
           (bVar4 = cmSystemTools::GetInterruptFlag(), bVar4)) goto LAB_002afa46;
      }
      lang = lang + 1;
      config = local_3b8;
      paVar3 = paStack_3b0;
    } while (lang != local_420);
  }
LAB_002afa46:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_478);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_3b8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_238);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)local_418);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&local_450);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
LAB_002afa90:
  if (local_3f8 != (pointer)&local_3e8) {
    operator_delete(local_3f8,CONCAT71(uStack_3e7,local_3e8) + 1);
  }
  return;
}

Assistant:

void cmGeneratorExpressionEvaluationFile::Generate(cmLocalGenerator* lg)
{
  mode_t perm = 0;
  std::string inputContent;
  if (this->InputIsContent) {
    inputContent = this->Input;
  } else {
    std::string inputFileName = this->Input;
    if (cmSystemTools::FileIsFullPath(inputFileName)) {
      inputFileName = cmSystemTools::CollapseFullPath(inputFileName);
    } else {
      inputFileName = this->FixRelativePath(inputFileName, PathForInput, lg);
    }
    lg->GetMakefile()->AddCMakeDependFile(inputFileName);
    cmSystemTools::GetPermissions(inputFileName.c_str(), perm);
    cmsys::ifstream fin(inputFileName.c_str());
    if (!fin) {
      std::ostringstream e;
      e << "Evaluation file \"" << inputFileName << "\" cannot be read.";
      lg->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return;
    }

    std::string line;
    std::string sep;
    while (cmSystemTools::GetLineFromStream(fin, line)) {
      inputContent += sep + line;
      sep = "\n";
    }
    inputContent += sep;
  }

  cmListFileBacktrace lfbt = this->OutputFileExpr->GetBacktrace();
  cmGeneratorExpression contentGE(lfbt);
  std::unique_ptr<cmCompiledGeneratorExpression> inputExpression =
    contentGE.Parse(inputContent);

  std::map<std::string, std::string> outputFiles;

  std::vector<std::string> allConfigs;
  lg->GetMakefile()->GetConfigurations(allConfigs);

  if (allConfigs.empty()) {
    allConfigs.emplace_back();
  }

  std::vector<std::string> enabledLanguages;
  cmGlobalGenerator* gg = lg->GetGlobalGenerator();
  gg->GetEnabledLanguages(enabledLanguages);

  for (std::string const& le : enabledLanguages) {
    for (std::string const& li : allConfigs) {
      this->Generate(lg, li, le, inputExpression.get(), outputFiles, perm);
      if (cmSystemTools::GetFatalErrorOccured()) {
        return;
      }
    }
  }
}